

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void CheckNumber(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  TidyAttrId TVar1;
  Dict *pDVar2;
  int iVar3;
  Bool BVar4;
  TidyTagId TVar5;
  uint code;
  char *pcVar6;
  
  if ((attval == (AttVal *)0x0) || (pcVar6 = attval->value, pcVar6 == (char *)0x0)) {
    code = 0x256;
  }
  else {
    if ((node != (Node *)0x0) && (pDVar2 = node->tag, pDVar2 != (Dict *)0x0)) {
      TVar5 = pDVar2->id;
      if (TVar5 == TidyTag_FRAMESET) {
        if ((attval->dict != (Attribute *)0x0) &&
           ((TVar1 = attval->dict->id, TVar1 == TidyAttr_COLS || (TVar1 == TidyAttr_ROWS)))) {
          return;
        }
        TVar5 = pDVar2->id;
      }
      if ((TVar5 == TidyTag_FONT) && ((*pcVar6 == '-' || (*pcVar6 == '+')))) {
        pcVar6 = pcVar6 + 1;
      }
    }
    if ((attval->attribute != (char *)0x0) &&
       (iVar3 = strcmp(attval->attribute,"tabindex"), iVar3 == 0)) {
      pcVar6 = pcVar6 + (*pcVar6 == '-');
    }
    do {
      if (*pcVar6 == '\0') {
        return;
      }
      BVar4 = prvTidyIsDigit((int)*pcVar6);
      pcVar6 = pcVar6 + 1;
    } while (BVar4 != no);
    code = 0x22b;
  }
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckNumber( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* don't check <frameset cols=... rows=...> */
    if ( nodeIsFRAMESET(node) &&
        (attrIsCOLS(attval) || attrIsROWS(attval)))
     return;

    p  = attval->value;
    
    /* font size may be preceded by + or - */
    if ( nodeIsFONT(node) && (*p == '+' || *p == '-') )
        ++p;
    /* tabindex may be preceded by - */
    if (attval->attribute && (strcmp(attval->attribute,"tabindex") == 0) && (*p == '-'))
        ++p;

    while (*p)
    {
        if (!TY_(IsDigit)(*p))
        {
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
            break;
        }
        ++p;
    }
}